

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O1

int pcap_set_buffer_size(pcap_t *p,int buffer_size)

{
  if (p->activated != 0) {
    builtin_strncpy(p->errbuf,"can\'t perform  operation on activated capture",0x2e);
    return -4;
  }
  if (0 < buffer_size) {
    (p->opt).buffer_size = buffer_size;
  }
  return 0;
}

Assistant:

int
pcap_set_buffer_size(pcap_t *p, int buffer_size)
{
	if (pcap_check_activated(p))
		return (PCAP_ERROR_ACTIVATED);
	if (buffer_size <= 0) {
		/*
		 * Silently ignore invalid values.
		 */
		return (0);
	}
	p->opt.buffer_size = buffer_size;
	return (0);
}